

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O1

void __thiscall
kj::Vector<kj::MainBuilder::Impl::Arg>::setCapacity
          (Vector<kj::MainBuilder::Impl::Arg> *this,size_t newSize)

{
  Arg *pAVar1;
  size_t sVar2;
  uint uVar3;
  RemoveConst<kj::MainBuilder::Impl::Arg> *pRVar4;
  ulong uVar5;
  Arg *pAVar6;
  __off_t in_RDX;
  ArrayBuilder<kj::MainBuilder::Impl::Arg> newBuilder;
  ArrayBuilder<kj::MainBuilder::Impl::Arg> local_38;
  
  uVar5 = ((long)(this->builder).pos - (long)(this->builder).ptr >> 3) * -0x3333333333333333;
  if (newSize <= uVar5 && uVar5 - newSize != 0) {
    ArrayBuilder<kj::MainBuilder::Impl::Arg>::truncate(&this->builder,(char *)newSize,in_RDX);
  }
  local_38.ptr = (Arg *)_::HeapArrayDisposer::allocateImpl
                                  (0x28,0,newSize,(_func_void_void_ptr *)0x0,
                                   (_func_void_void_ptr *)0x0);
  local_38.endPtr = local_38.ptr + newSize;
  local_38.disposer = (ArrayDisposer *)&_::HeapArrayDisposer::instance;
  pAVar1 = (this->builder).pos;
  local_38.pos = local_38.ptr;
  for (pAVar6 = (this->builder).ptr; pAVar6 != pAVar1; pAVar6 = pAVar6 + 1) {
    sVar2 = (pAVar6->title).content.size_;
    ((local_38.pos)->title).content.ptr = (pAVar6->title).content.ptr;
    ((local_38.pos)->title).content.size_ = sVar2;
    ((local_38.pos)->callback).impl.disposer = (pAVar6->callback).impl.disposer;
    ((local_38.pos)->callback).impl.ptr = (pAVar6->callback).impl.ptr;
    (pAVar6->callback).impl.ptr = (Iface *)0x0;
    uVar3 = pAVar6->maxCount;
    (local_38.pos)->minCount = pAVar6->minCount;
    (local_38.pos)->maxCount = uVar3;
    local_38.pos = local_38.pos + 1;
  }
  ArrayBuilder<kj::MainBuilder::Impl::Arg>::operator=(&this->builder,&local_38);
  pAVar1 = local_38.endPtr;
  pRVar4 = local_38.pos;
  pAVar6 = local_38.ptr;
  if (local_38.ptr != (Arg *)0x0) {
    local_38.ptr = (Arg *)0x0;
    local_38.pos = (RemoveConst<kj::MainBuilder::Impl::Arg> *)0x0;
    local_38.endPtr = (Arg *)0x0;
    (*(code *)**(undefined8 **)local_38.disposer)
              (local_38.disposer,pAVar6,0x28,
               ((long)pRVar4 - (long)pAVar6 >> 3) * -0x3333333333333333,
               ((long)pAVar1 - (long)pAVar6 >> 3) * -0x3333333333333333,
               ArrayDisposer::Dispose_<kj::MainBuilder::Impl::Arg,_false>::destruct);
  }
  return;
}

Assistant:

void setCapacity(size_t newSize) {
    if (builder.size() > newSize) {
      builder.truncate(newSize);
    }
    ArrayBuilder<T> newBuilder = heapArrayBuilder<T>(newSize);
    newBuilder.addAll(kj::mv(builder));
    builder = kj::mv(newBuilder);
  }